

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_action.cpp
# Opt level: O0

bool __thiscall
cppnet::EpollEventActions::AddConnection(EpollEventActions *this,Event *event,Address *addr)

{
  bool bVar1;
  uint16_t uVar2;
  element_type *peVar3;
  uint64_t uVar4;
  SysCallInt32Result SVar5;
  element_type *peVar6;
  SingletonLogger *pSVar7;
  undefined1 local_70 [8];
  shared_ptr<cppnet::RWSocket> rw_sock_1;
  shared_ptr<cppnet::RWSocket> rw_sock;
  SysCallInt32Result ret;
  undefined1 local_38 [8];
  shared_ptr<cppnet::Socket> sock;
  Address *addr_local;
  Event *event_local;
  EpollEventActions *this_local;
  
  sock.super___shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)addr;
  uVar2 = Event::GetType(event);
  if ((uVar2 & 0x20) == 0) {
    Event::AddType(event,ET_CONNECT);
    Event::GetSocket((Event *)local_38);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_38);
    if (bVar1) {
      uVar2 = Event::GetType(event);
      if ((uVar2 & 0x80) == 0) {
        peVar3 = std::__shared_ptr_access<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_38);
        uVar4 = Socket::GetSocket(peVar3);
        SocketNoblocking(uVar4);
        peVar3 = std::__shared_ptr_access<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_38);
        uVar4 = Socket::GetSocket(peVar3);
        SVar5 = OsHandle::Connect(uVar4,(Address *)
                                        sock.
                                        super___shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi);
        std::dynamic_pointer_cast<cppnet::RWSocket,cppnet::Socket>
                  ((shared_ptr<cppnet::Socket> *)
                   &rw_sock_1.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        rw_sock.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = SVar5._return_value;
        if ((int)rw_sock.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi == 0) {
          peVar6 = std::
                   __shared_ptr_access<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&rw_sock_1.
                                  super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount);
          (*(peVar6->super_Socket)._vptr_Socket[0x10])(peVar6,0);
          this_local._7_1_ = true;
        }
        else {
          rw_sock.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          ._4_4_ = SVar5._errno;
          if ((rw_sock.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi._4_4_ == 0x73) ||
             (rw_sock.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi._4_4_ == 0x2733)) {
            std::dynamic_pointer_cast<cppnet::RWSocket,cppnet::Socket>
                      ((shared_ptr<cppnet::Socket> *)local_70);
            peVar6 = std::
                     __shared_ptr_access<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_70);
            (*(peVar6->super_Socket)._vptr_Socket[0xb])(peVar6,2000,0);
            this_local._7_1_ = false;
            std::shared_ptr<cppnet::RWSocket>::~shared_ptr((shared_ptr<cppnet::RWSocket> *)local_70)
            ;
          }
          else {
            peVar6 = std::
                     __shared_ptr_access<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&rw_sock_1.
                                      super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount);
            (*(peVar6->super_Socket)._vptr_Socket[0x10])(peVar6,3);
            pSVar7 = Singleton<cppnet::SingletonLogger>::Instance();
            SingletonLogger::Warn
                      (pSVar7,
                       "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/event/epoll/epoll_action.cpp"
                       ,0xe7,"connect event failed! %d",
                       (ulong)rw_sock.
                              super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi._4_4_);
            this_local._7_1_ = false;
          }
        }
        std::shared_ptr<cppnet::RWSocket>::~shared_ptr
                  ((shared_ptr<cppnet::RWSocket> *)
                   &rw_sock_1.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      pSVar7 = Singleton<cppnet::SingletonLogger>::Instance();
      SingletonLogger::Warn
                (pSVar7,
                 "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/event/epoll/epoll_action.cpp"
                 ,0xea,"connection event is already destroyed!,%s","AddConnection");
      this_local._7_1_ = false;
    }
    std::shared_ptr<cppnet::Socket>::~shared_ptr((shared_ptr<cppnet::Socket> *)local_38);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool EpollEventActions::AddConnection(Event* event, Address& addr) {
    if (event->GetType() & ET_CONNECT) {
        return false;
    }
    event->AddType(ET_CONNECT);

    auto sock = event->GetSocket();
    if (sock) {
        // the socket must not in EPOLL
        if (event->GetType() & ET_INACTIONS) {
            return false;
        }
   
        // set no unblocking before connect.
        SocketNoblocking(sock->GetSocket());

        auto ret = OsHandle::Connect(sock->GetSocket(), addr);

        auto rw_sock = std::dynamic_pointer_cast<RWSocket>(sock);
        if (ret._return_value == 0) {
            rw_sock->OnConnect(CEC_SUCCESS);
            return true;

        } else if (ret._errno == EINPROGRESS || ret._errno == WSAEWOULDBLOCK) {
            auto rw_sock = std::dynamic_pointer_cast<RWSocket>(sock);
            rw_sock->AddTimer(__connect_recheck_time_ms);
            return false;
        }
        rw_sock->OnConnect(CEC_CONNECT_REFUSE);
        LOG_WARN("connect event failed! %d", ret._errno);
        return false;
    }
    LOG_WARN("connection event is already destroyed!,%s", "AddConnection");
    return false;
}